

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

bool __thiscall FOptionMenuItemControl::Activate(FOptionMenuItemControl *this)

{
  DEnterKey *this_00;
  FSoundID *this_01;
  float volume;
  DMenu *input;
  FOptionMenuItemControl *local_10;
  FOptionMenuItemControl *this_local;
  
  this_01 = (FSoundID *)((long)&input + 4);
  local_10 = this;
  FSoundID::FSoundID(this_01,"menu/choose");
  volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
  S_Sound(0x22,this_01,volume,0.0);
  this->mWaiting = true;
  this_00 = (DEnterKey *)DObject::operator_new((DObject *)0x38,(size_t)this_01);
  DEnterKey::DEnterKey(this_00,DMenu::CurrentMenu,&this->mInput);
  M_ActivateMenu((DMenu *)this_00);
  return true;
}

Assistant:

bool Activate()
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/choose", snd_menuvolume, ATTN_NONE);
		mWaiting = true;
		DMenu *input = new DEnterKey(DMenu::CurrentMenu, &mInput);
		M_ActivateMenu(input);
		return true;
	}